

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

int ModifiedGS(N_Vector *v,realtype **h,int k,int p,realtype *new_vk_norm)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  realtype rVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar4 = (long)k;
  rVar5 = N_VDotProd(v[lVar4],v[lVar4]);
  dVar7 = 0.0;
  if (0.0 < rVar5) {
    rVar5 = N_VDotProd(v[lVar4],v[lVar4]);
    if (rVar5 < 0.0) {
      dVar7 = sqrt(rVar5);
    }
    else {
      dVar7 = SQRT(rVar5);
    }
    dVar7 = dVar7 * 1000.0;
  }
  iVar1 = k + -1;
  uVar2 = 0;
  if (0 < k - p) {
    uVar2 = (ulong)(uint)(k - p);
  }
  for (uVar3 = uVar2; (long)uVar3 < lVar4; uVar3 = uVar3 + 1) {
    rVar5 = N_VDotProd(v[uVar3],v[lVar4]);
    h[uVar3][iVar1] = rVar5;
    N_VLinearSum(1.0,v[lVar4],-rVar5,v[uVar3],v[lVar4]);
  }
  rVar5 = N_VDotProd(v[lVar4],v[lVar4]);
  dVar6 = 0.0;
  if (0.0 < rVar5) {
    rVar5 = N_VDotProd(v[lVar4],v[lVar4]);
    if (rVar5 < 0.0) {
      dVar6 = sqrt(rVar5);
    }
    else {
      dVar6 = SQRT(rVar5);
    }
  }
  *new_vk_norm = dVar6;
  if ((dVar6 + dVar7 == dVar7) && (!NAN(dVar6 + dVar7) && !NAN(dVar7))) {
    dVar7 = 0.0;
    for (; (long)uVar2 < lVar4; uVar2 = uVar2 + 1) {
      rVar5 = N_VDotProd(v[uVar2],v[lVar4]);
      dVar6 = h[uVar2][iVar1];
      dVar8 = dVar6 * 1000.0;
      if ((rVar5 + dVar8 != dVar8) || (NAN(rVar5 + dVar8) || NAN(dVar8))) {
        h[uVar2][iVar1] = dVar6 + rVar5;
        N_VLinearSum(1.0,v[lVar4],-rVar5,v[uVar2],v[lVar4]);
        dVar7 = dVar7 + rVar5 * rVar5;
      }
    }
    rVar5 = 0.0;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar7 = *new_vk_norm * *new_vk_norm - dVar7;
      if (0.0 < dVar7) {
        if (dVar7 < 0.0) {
          rVar5 = sqrt(dVar7);
        }
        else {
          rVar5 = SQRT(dVar7);
        }
      }
      *new_vk_norm = rVar5;
    }
  }
  return 0;
}

Assistant:

int ModifiedGS(N_Vector *v, realtype **h, int k, int p, 
               realtype *new_vk_norm)
{
  int  i, k_minus_1, i0;
  realtype new_norm_2, new_product, vk_norm, temp;
  
  vk_norm = SUNRsqrt(N_VDotProd(v[k],v[k]));
  k_minus_1 = k - 1;
  i0 = SUNMAX(k-p, 0);
  
  /* Perform modified Gram-Schmidt */
  
  for (i=i0; i < k; i++) {
    h[i][k_minus_1] = N_VDotProd(v[i], v[k]);
    N_VLinearSum(ONE, v[k], -h[i][k_minus_1], v[i], v[k]);
  }

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));

  /* If the norm of the new vector at v[k] is less than
     FACTOR (== 1000) times unit roundoff times the norm of the
     input vector v[k], then the vector will be reorthogonalized
     in order to ensure that nonorthogonality is not being masked
     by a very small vector length. */

  temp = FACTOR * vk_norm;
  if ((temp + (*new_vk_norm)) != temp) return(0);
  
  new_norm_2 = ZERO;

  for (i=i0; i < k; i++) {
    new_product = N_VDotProd(v[i], v[k]);
    temp = FACTOR * h[i][k_minus_1];
    if ((temp + new_product) == temp) continue;
    h[i][k_minus_1] += new_product;
    N_VLinearSum(ONE, v[k],-new_product, v[i], v[k]);
    new_norm_2 += SUNSQR(new_product);
  }

  if (new_norm_2 != ZERO) {
    new_product = SUNSQR(*new_vk_norm) - new_norm_2;
    *new_vk_norm = (new_product > ZERO) ? SUNRsqrt(new_product) : ZERO;
  }

  return(0);
}